

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Get(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *root,size_t *unresolvedTokenIndex)

{
  uint uVar1;
  Token *pTVar2;
  ushort uVar3;
  Token *pTVar4;
  long lVar5;
  MemberIterator m;
  undefined8 local_38;
  
  pTVar2 = this->tokens_;
  lVar5 = -(long)pTVar2;
  pTVar4 = pTVar2;
  do {
    if (pTVar4 == pTVar2 + this->tokenCount_) {
      return root;
    }
    uVar3 = (root->data_).f.flags & 7;
    if (uVar3 == 4) {
      uVar1 = pTVar4->index;
      if (((ulong)uVar1 == 0xffffffff) || ((root->data_).s.length <= uVar1)) {
LAB_00109116:
        if (unresolvedTokenIndex != (size_t *)0x0) {
          *unresolvedTokenIndex = -((long)&this->tokens_->name + lVar5) >> 4;
        }
        return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)0x0;
      }
      root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((ulong)uVar1 * 0x10 + ((ulong)(root->data_).s.str & 0xffffffffffff));
    }
    else {
      if ((uVar3 != 3) ||
         (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&stack0xffffffffffffffc8,(Ch *)root),
         local_38 ==
         (ulong)(root->data_).s.length * 0x20 + ((ulong)(root->data_).s.str & 0xffffffffffff)))
      goto LAB_00109116;
      root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)(local_38 + 0x10);
      pTVar2 = this->tokens_;
    }
    pTVar4 = pTVar4 + 1;
    lVar5 = lVar5 + -0x10;
  } while( true );
}

Assistant:

ValueType* Get(ValueType& root, size_t* unresolvedTokenIndex = 0) const {
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
            case kObjectType:
                {
                    typename ValueType::MemberIterator m = v->FindMember(GenericStringRef<Ch>(t->name, t->length));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                continue;
            case kArrayType:
                if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                    break;
                v = &((*v)[t->index]);
                continue;
            default:
                break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return 0;
        }
        return v;
    }